

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O3

void gflags::anon_unknown_5::
     Test_ParseCommandLineFlagsUsesLastDefinitionTest_WhenFlagIsDefinedTwiceOnCommandLine::Run(void)

{
  uint uVar1;
  int32 iVar2;
  undefined8 extraout_RAX;
  FlagSaver fs;
  FlagSaver local_10;
  
  FlagSaver::FlagSaver(&local_10);
  fprintf(_stderr,"Running test %s/%s\n","ParseCommandLineFlagsUsesLastDefinitionTest",
          "WhenFlagIsDefinedTwiceOnCommandLine");
  uVar1 = ParseTestFlag(true,3,&PTR_anon_var_dwarf_1dfd3_0015bc30);
  _GLOBAL__N_1::Test_ParseCommandLineFlagsUsesLastDefinitionTest_WhenFlagIsDefinedTwiceOnCommandLine
  ::Run((Test_ParseCommandLineFlagsUsesLastDefinitionTest_WhenFlagIsDefinedTwiceOnCommandLine *)
        (ulong)uVar1);
  iVar2 = ParseTestFlag(false,3,&PTR_anon_var_dwarf_1dfd3_0015bc30);
  if (iVar2 == 2) {
    FlagSaver::~FlagSaver(&local_10);
    return;
  }
  _GLOBAL__N_1::Test_ParseCommandLineFlagsUsesLastDefinitionTest_WhenFlagIsDefinedTwiceOnCommandLine
  ::Run();
  FlagSaver::~FlagSaver(&local_10);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(ParseCommandLineFlagsUsesLastDefinitionTest,
     WhenFlagIsDefinedTwiceOnCommandLine) {
  const char* argv[] = {
    "my_test",
    "--test_flag=1",
    "--test_flag=2",
    NULL,
  };

  EXPECT_EQ(2, ParseTestFlag(true, arraysize(argv) - 1, argv));
  EXPECT_EQ(2, ParseTestFlag(false, arraysize(argv) - 1, argv));
}